

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vpgen_clip_polygon.cpp
# Opt level: O2

void __thiscall agg::vpgen_clip_polygon::line_to(vpgen_clip_polygon *this,double x,double y)

{
  uint uVar1;
  uint uVar2;
  
  *(undefined8 *)(this + 0x78) = 0;
  uVar1 = clipping_flags(this,x,y);
  if (*(uint *)(this + 0x30) == uVar1) {
    if (uVar1 != 0) goto LAB_00116e2a;
    *(double *)(this + 0x38) = x;
    *(double *)(this + 0x58) = y;
    uVar2 = 1;
  }
  else {
    uVar2 = clip_liang_barsky<double>
                      (*(double *)(this + 0x20),*(double *)(this + 0x28),x,y,
                       (rect_base<double> *)this,(double *)(this + 0x38),(double *)(this + 0x58));
  }
  *(uint *)(this + 0x78) = uVar2;
LAB_00116e2a:
  *(uint *)(this + 0x30) = uVar1;
  *(double *)(this + 0x20) = x;
  *(double *)(this + 0x28) = y;
  return;
}

Assistant:

void vpgen_clip_polygon::line_to(double x, double y)
    {
        m_vertex = 0;
        m_num_vertices = 0;
        unsigned flags = clipping_flags(x, y);

        if(m_clip_flags == flags)
        {
            if(flags == 0)
            {
                m_x[0] = x;
                m_y[0] = y;
                m_num_vertices = 1;
            }
        }
        else
        {
            m_num_vertices = clip_liang_barsky(m_x1, m_y1, 
                                               x, y, 
                                               m_clip_box, 
                                               m_x, m_y);
        }

        m_clip_flags = flags;
        m_x1 = x;
        m_y1 = y;
    }